

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O3

string * __thiscall
google::DescribeOneFlag_abi_cxx11_
          (string *__return_storage_ptr__,google *this,CommandLineFlagInfo *flag)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 *puVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  long *plVar7;
  size_type *psVar8;
  char cVar9;
  string *final_string;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  long lVar14;
  ulong uVar15;
  _Alloc_hider __s;
  char *format;
  int chars_in_line;
  string main_part;
  int local_a4;
  string local_a0;
  string *local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  size_type sVar13;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  SStringPrintf(&local_50,"    -%s (%s)",*(undefined8 *)this,*(undefined8 *)(this + 0x40));
  sVar13 = local_50._M_string_length;
  __s._M_p = local_50._M_dataplus._M_p;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_80 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  local_a4 = 0;
  local_58 = &__return_storage_ptr__->field_2;
  sVar5 = strlen(__s._M_p);
  if (sVar5 == (long)(int)sVar13) {
    iVar4 = 0;
    do {
      pcVar6 = strchr(__s._M_p,10);
      final_string = local_80;
      if (pcVar6 == (char *)0x0) {
        iVar10 = iVar4 + (int)sVar13;
        if (iVar10 < 0x50) {
          std::__cxx11::string::append((char *)local_80);
          local_a4 = iVar10;
          goto LAB_001975f9;
        }
LAB_001974f2:
        uVar15 = (ulong)(0x4f - iVar4);
        uVar11 = uVar15;
        while( true ) {
          iVar4 = isspace((int)__s._M_p[uVar11]);
          if (iVar4 != 0) break;
          uVar15 = (ulong)((int)uVar15 - 1);
          bVar2 = (long)uVar11 < 2;
          uVar11 = uVar11 - 1;
          if (bVar2) {
            std::__cxx11::string::append((char *)final_string);
            local_a4 = 0x50;
            goto LAB_001975f9;
          }
        }
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,__s._M_p,__s._M_p + (uVar11 & 0xffffffff));
        std::__cxx11::string::_M_append((char *)final_string,(ulong)local_a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        local_a4 = local_a4 + (int)uVar11;
        lVar14 = uVar15 - 1;
        do {
          cVar9 = __s._M_p[lVar14 + 1];
          iVar4 = isspace((int)cVar9);
          lVar14 = lVar14 + 1;
        } while (iVar4 != 0);
      }
      else {
        if ((long)(ulong)(0x50 - iVar4) <= (long)pcVar6 - (long)__s._M_p) goto LAB_001974f2;
        std::__cxx11::string::append((char *)local_80,(ulong)__s._M_p);
        lVar14 = (long)(int)((long)pcVar6 - (long)__s._M_p);
        cVar9 = __s._M_p[lVar14 + 1];
        lVar14 = lVar14 + 1;
      }
      final_string = local_80;
      if (cVar9 == '\0') {
LAB_001975f9:
        local_78[0] = local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"type: ","");
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_78,*(ulong *)(this + 0x20));
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        psVar8 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_a0.field_2._M_allocated_capacity = *psVar8;
          local_a0.field_2._8_8_ = plVar7[3];
        }
        else {
          local_a0.field_2._M_allocated_capacity = *psVar8;
          local_a0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_a0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        AddString(&local_a0,final_string,&local_a4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        if (local_78[0] != local_68) {
          operator_delete(local_78[0]);
        }
        local_78[0] = local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"default","");
        puVar3 = local_78[0];
        uVar1 = *(undefined8 *)(this + 0x80);
        iVar4 = strcmp(*(char **)(this + 0x20),"string");
        format = "%s: %s";
        pcVar6 = "%s: %s";
        if (iVar4 == 0) {
          pcVar6 = "%s: \"%s\"";
        }
        StringPrintf_abi_cxx11_(&local_a0,pcVar6,puVar3,uVar1);
        AddString(&local_a0,final_string,&local_a4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        if (local_78[0] != local_68) {
          operator_delete(local_78[0]);
        }
        if (this[0xc1] == (google)0x0) {
          local_78[0] = local_68;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"currently","");
          puVar3 = local_78[0];
          uVar1 = *(undefined8 *)(this + 0x60);
          iVar4 = strcmp(*(char **)(this + 0x20),"string");
          if (iVar4 == 0) {
            format = "%s: \"%s\"";
          }
          StringPrintf_abi_cxx11_(&local_a0,format,puVar3,uVar1);
          AddString(&local_a0,final_string,&local_a4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          if (local_78[0] != local_68) {
            operator_delete(local_78[0]);
          }
        }
        StringAppendF(final_string,"\n");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        return final_string;
      }
      StringAppendF(local_80,"\n      ");
      uVar12 = (int)sVar13 - (int)lVar14;
      sVar13 = (size_type)uVar12;
      __s._M_p = __s._M_p + lVar14;
      local_a4 = 6;
      sVar5 = strlen(__s._M_p);
      iVar4 = 6;
    } while (sVar5 == (long)(int)uVar12);
  }
  __assert_fail("chars_left == strlen(c_string)",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags_reporting.cc"
                ,0x81,"string google::DescribeOneFlag(const CommandLineFlagInfo &)");
}

Assistant:

string DescribeOneFlag(const CommandLineFlagInfo& flag) {
  string main_part;
  SStringPrintf(&main_part, "    -%s (%s)",
                flag.name.c_str(),
                flag.description.c_str());
  const char* c_string = main_part.c_str();
  int chars_left = static_cast<int>(main_part.length());
  string final_string = "";
  int chars_in_line = 0;  // how many chars in current line so far?
  while (1) {
    assert(chars_left == strlen(c_string));  // Unless there's a \0 in there?
    const char* newline = strchr(c_string, '\n');
    if (newline == NULL && chars_in_line+chars_left < kLineLength) {
      // The whole remainder of the string fits on this line
      final_string += c_string;
      chars_in_line += chars_left;
      break;
    }
    if (newline != NULL && newline - c_string < kLineLength - chars_in_line) {
      int n = static_cast<int>(newline - c_string);
      final_string.append(c_string, n);
      chars_left -= n + 1;
      c_string += n + 1;
    } else {
      // Find the last whitespace on this 80-char line
      int whitespace = kLineLength-chars_in_line-1;  // < 80 chars/line
      while ( whitespace > 0 && !isspace(c_string[whitespace]) ) {
        --whitespace;
      }
      if (whitespace <= 0) {
        // Couldn't find any whitespace to make a line break.  Just dump the
        // rest out!
        final_string += c_string;
        chars_in_line = kLineLength;  // next part gets its own line for sure!
        break;
      }
      final_string += string(c_string, whitespace);
      chars_in_line += whitespace;
      while (isspace(c_string[whitespace]))  ++whitespace;
      c_string += whitespace;
      chars_left -= whitespace;
    }
    if (*c_string == '\0')
      break;
    StringAppendF(&final_string, "\n      ");
    chars_in_line = 6;
  }

  // Append data type
  AddString(string("type: ") + flag.type, &final_string, &chars_in_line);
  // The listed default value will be the actual default from the flag
  // definition in the originating source file, unless the value has
  // subsequently been modified using SetCommandLineOptionWithMode() with mode
  // SET_FLAGS_DEFAULT, or by setting FLAGS_foo = bar before ParseCommandLineFlags().
  AddString(PrintStringFlagsWithQuotes(flag, "default", false), &final_string,
            &chars_in_line);
  if (!flag.is_default) {
    AddString(PrintStringFlagsWithQuotes(flag, "currently", true),
              &final_string, &chars_in_line);
  }

  StringAppendF(&final_string, "\n");
  return final_string;
}